

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

NULLCRef *
GetExecutorResultObject
          (NULLCRef *__return_storage_ptr__,uint tempStackType,uint *tempStackArrayBase)

{
  NULLCRef ptr;
  char *pcVar1;
  char *in_stack_ffffffffffffffa4;
  NULLCRef *result;
  NULLCRef tmp;
  float tmpFloat;
  double tmpDouble;
  uint *tempStackArrayBase_local;
  uint tempStackType_local;
  
  if (tempStackType == 0) {
    memset(__return_storage_ptr__,0,0xc);
  }
  else if (tempStackType == 6) {
    __return_storage_ptr__->typeID = 6;
    pcVar1 = (char *)nullcAllocateTyped(6);
    __return_storage_ptr__->ptr = pcVar1;
    *(float *)__return_storage_ptr__->ptr = (float)*(double *)tempStackArrayBase;
  }
  else if (tempStackType == 0xd) {
    *(undefined8 *)__return_storage_ptr__ = *(undefined8 *)tempStackArrayBase;
    *(uint *)((long)&__return_storage_ptr__->ptr + 4) = tempStackArrayBase[2];
  }
  else {
    tmp.typeID = (uint)((ulong)tempStackArrayBase >> 0x20);
    ptr.ptr = in_stack_ffffffffffffffa4;
    ptr.typeID = tmp.typeID;
    NULLC::CopyObject(ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef GetExecutorResultObject(unsigned tempStackType, unsigned *tempStackArrayBase)
{
	if(tempStackType == NULLC_TYPE_VOID)
	{
		NULLCRef result = { 0, 0 };

		return result;
	}
	else if(tempStackType == NULLC_TYPE_FLOAT)
	{
		// 'float' is placed as a 'double' value on the stack
		NULLCRef result = { NULLC_TYPE_FLOAT, (char*)nullcAllocateTyped(NULLC_TYPE_FLOAT) };

		double tmpDouble;
		memcpy(&tmpDouble, tempStackArrayBase, sizeof(tmpDouble));

		float tmpFloat = float(tmpDouble);
		memcpy(result.ptr, &tmpFloat, sizeof(tmpFloat));

		return result;
	}
	else if(tempStackType == NULLC_TYPE_AUTO_REF)
	{
		// Return 'auto ref' as is
		NULLCRef result;
		memcpy(&result, tempStackArrayBase, sizeof(result));

		return result;
	}

	NULLCRef tmp = { tempStackType, (char*)tempStackArrayBase };

	return NULLC::CopyObject(tmp);
}